

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void STATE_board_print_debug(chess_state_t *s)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  bool bVar7;
  
  lVar1 = 7;
  do {
    fprintf(_stdout,"#%c ",(ulong)((int)lVar1 + 0x31));
    lVar6 = 0;
    do {
      uVar2 = 1L << ((char)lVar6 + (char)lVar1 * '\b' & 0x3fU);
      cVar4 = '-';
      lVar3 = -0x38;
      do {
        if ((*(ulong *)((long)s->bitboard + lVar3 + 0x68) & uVar2) != 0) {
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x38) & uVar2) != 0) {
            cVar4 = 'P';
          }
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x40) & uVar2) != 0) {
            cVar4 = 'N';
          }
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x48) & uVar2) != 0) {
            cVar4 = 'B';
          }
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x50) & uVar2) != 0) {
            cVar4 = 'R';
          }
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x58) & uVar2) != 0) {
            cVar4 = 'Q';
          }
          cVar5 = cVar4;
          if ((*(ulong *)((long)s->bitboard + lVar3 + 0x60) & uVar2) != 0) {
            cVar5 = 'K';
          }
          cVar4 = cVar5 + ' ';
          if (lVar3 != 0) {
            cVar4 = cVar5;
          }
        }
        lVar3 = lVar3 + 0x38;
      } while (lVar3 == 0);
      fprintf(_stdout,"%c ",(ulong)(uint)(int)cVar4);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    fputc(10,_stdout);
    bVar7 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar7);
  fwrite("   A B C D E F G H\n",0x13,1,_stdout);
  return;
}

Assistant:

void STATE_board_print_debug(const chess_state_t *s)
{
    int rank, file, color;
    for(rank = 7; rank >= 0; rank--) {
        fprintf(stdout, "#%c ", rank + '1');
        for(file = 0; file < 8; file++) {
            char c = '-';
            for(color = WHITE; color <= BLACK; color++) {
                if(s->bitboard[color*NUM_TYPES+ALL] & BITBOARD_RANK_FILE(rank, file)) {
                    if(s->bitboard[color*NUM_TYPES+PAWN] & BITBOARD_RANK_FILE(rank, file)) c = 'P';
                    if(s->bitboard[color*NUM_TYPES+KNIGHT] & BITBOARD_RANK_FILE(rank, file)) c = 'N';
                    if(s->bitboard[color*NUM_TYPES+BISHOP] & BITBOARD_RANK_FILE(rank, file)) c = 'B';
                    if(s->bitboard[color*NUM_TYPES+ROOK] & BITBOARD_RANK_FILE(rank, file)) c = 'R';
                    if(s->bitboard[color*NUM_TYPES+QUEEN] & BITBOARD_RANK_FILE(rank, file)) c = 'Q';
                    if(s->bitboard[color*NUM_TYPES+KING] & BITBOARD_RANK_FILE(rank, file)) c = 'K';
                    if(color == BLACK) c += 32;
                }
            }
            fprintf(stdout, "%c ", c);
        }
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "   A B C D E F G H\n");
}